

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall JetHead::Socket::getRemoteAddress(Socket *this,Address *addr)

{
  Address local_90;
  Address local_5c;
  int local_38;
  socklen_t local_34;
  int res;
  socklen_t sock_len;
  sockaddr_in sock_addr;
  Address *addr_local;
  Socket *this_local;
  
  local_34 = 0x10;
  sock_addr.sin_zero = (uchar  [8])addr;
  local_38 = getpeername(this->mFd,(sockaddr *)&res,&local_34);
  if (local_38 == 0) {
    Address::Address(&local_5c,(sockaddr_in *)&res,local_34);
    Address::operator=((Address *)sock_addr.sin_zero,&local_5c);
    Address::~Address(&local_5c);
  }
  else {
    Address::Address(&local_90);
    Address::operator=((Address *)sock_addr.sin_zero,&local_90);
    Address::~Address(&local_90);
    if ((this->mSockStream & 1U) == 0) {
      Address::operator=((Address *)sock_addr.sin_zero,&this->mLastDatagramSender);
      return 0;
    }
  }
  return local_38;
}

Assistant:

int Socket::getRemoteAddress( Socket::Address &addr )
{
	struct sockaddr_in sock_addr;
	socklen_t sock_len = sizeof( sock_addr );
	
	int res = getpeername( mFd, (struct sockaddr*)&sock_addr, &sock_len );
	
	if ( res == 0 )
	{
		addr = Socket::Address( &sock_addr, sock_len );
	}
	else
	{
		addr = Socket::Address();
		if (not mSockStream)
		{
			addr = mLastDatagramSender;
			return 0;
		}
	}
	
	return res;
}